

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

bool __thiscall libcellml::Importer::removeImportSource(Importer *this,size_t index)

{
  bool bVar1;
  ImportSourcePtr importSrc;
  LoggerImpl *local_18;
  
  importSource((Importer *)&stack0xffffffffffffffe0,(size_t)this);
  bVar1 = removeImportSource(this,(ImportSourcePtr *)&stack0xffffffffffffffe0);
  if (local_18 != (LoggerImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return bVar1;
}

Assistant:

bool Importer::removeImportSource(size_t index)
{
    auto importSrc = importSource(index);
    return removeImportSource(importSrc);
}